

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxerutil.cc
# Opt level: O0

bool mkvmuxer::WriteEbmlElement(IMkvWriter *writer,uint64 type,float value)

{
  int32 iVar1;
  float value_local;
  uint64 type_local;
  IMkvWriter *writer_local;
  
  if (writer == (IMkvWriter *)0x0) {
    writer_local._7_1_ = false;
  }
  else {
    iVar1 = WriteID(writer,type);
    if (iVar1 == 0) {
      iVar1 = WriteUInt(writer,4);
      if (iVar1 == 0) {
        iVar1 = SerializeFloat(writer,value);
        if (iVar1 == 0) {
          writer_local._7_1_ = true;
        }
        else {
          writer_local._7_1_ = false;
        }
      }
      else {
        writer_local._7_1_ = false;
      }
    }
    else {
      writer_local._7_1_ = false;
    }
  }
  return writer_local._7_1_;
}

Assistant:

bool WriteEbmlElement(IMkvWriter* writer, uint64 type, float value) {
  if (!writer)
    return false;

  if (WriteID(writer, type))
    return false;

  if (WriteUInt(writer, 4))
    return false;

  if (SerializeFloat(writer, value))
    return false;

  return true;
}